

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void Eigen::internal::
     triangular_solver_selector<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_2,_0,_-1>
     ::run(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *lhs,
          Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *rhs)

{
  DenseIndex otherSize;
  BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true> *this;
  Index depth;
  Index rows;
  Index cols;
  Scalar *_tri;
  Index triStride;
  ScalarWithConstIfNotLvalue *_other;
  Index otherStride;
  undefined1 local_78 [8];
  BlockingType blocking;
  Index othersize;
  Index size;
  type actualLhs;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *rhs_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *lhs_local;
  
  this = (BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true> *)
         blas_traits<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
         extract(lhs);
  depth = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      *)lhs);
  blocking.m_sizeW =
       MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::cols
                 ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                   *)rhs);
  rows = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::rows
                   ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     *)rhs);
  cols = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::cols
                   ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     *)rhs);
  gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::gemm_blocking_space
            ((gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *)local_78,rows,cols,
             depth);
  otherSize = blocking.m_sizeW;
  _tri = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::coeffRef
                   ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     *)this,0,0);
  triStride = BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
              outerStride(this);
  _other = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>::
           coeffRef((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     *)rhs,0,0);
  otherStride = BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
                outerStride((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                             *)rhs);
  triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0>::run
            (depth,otherSize,_tri,triStride,_other,otherStride,
             (level3_blocking<double,_double> *)local_78);
  gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::~gemm_blocking_space
            ((gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *)local_78);
  return;
}

Assistant:

static void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.outerStride(), blocking);
  }